

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_exp_param_t * get_scaled_exp_params(vrna_md_t *md,double pfs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  vrna_exp_param_t *pvVar11;
  char *pcVar12;
  long lVar13;
  size_t sVar14;
  int (*paaiVar15) [5] [5];
  long lVar16;
  int (*paaiVar17) [5] [5];
  int (*paaiVar18) [5] [5];
  int m_1;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  double (*padVar22) [5];
  double (*padVar23) [8];
  int (*paaiVar24) [5] [5];
  double (*paaadVar25) [8] [5] [5];
  double (*paaadVar26) [8] [5] [5];
  double (*paaadVar27) [8] [5] [5];
  double (*paaaadVar28) [8] [5] [5] [5];
  double (*paaaadVar29) [8] [5] [5] [5];
  double (*paaaadVar30) [8] [5] [5] [5];
  double (*paaaadVar31) [8] [5] [5] [5];
  int (*paaiVar32) [5] [5];
  int (*paaiVar33) [5] [5];
  int (*paaiVar34) [5] [5];
  int (*paaiVar35) [5] [5];
  int (*paaiVar36) [5] [5];
  int (*paaiVar37) [5] [5];
  int (*paiVar38) [5];
  vrna_exp_param_t *pvVar39;
  vrna_exp_param_t *pvVar40;
  int (*paaaaiVar41) [8] [5] [5] [5];
  int (*paiVar42) [5];
  double (*paaaaadVar43) [8] [5] [5] [5] [5];
  double (*paaaaadVar44) [8] [5] [5] [5] [5];
  double (*paaaaadVar45) [8] [5] [5] [5] [5];
  double (*paaaaadVar46) [8] [5] [5] [5] [5];
  double (*paaaaadVar47) [8] [5] [5] [5] [5];
  int m;
  int iVar48;
  int (*paiVar49) [5];
  int (*paaiVar50) [5] [5];
  long lVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  int (*paiVar55) [8];
  int (*paaiVar56) [5] [5];
  int (*paaaiVar57) [8] [5] [5];
  int (*paaaaaiVar58) [8] [5] [5] [5] [5];
  int (*paiVar59) [5];
  int (*paiVar60) [5];
  int (*paiVar61) [8];
  long lVar62;
  int (*paaaiVar63) [8] [5] [5];
  int (*paaaaiVar64) [8] [5] [5] [5];
  int (*paaaaaiVar65) [8] [5] [5] [5] [5];
  int (*paiVar66) [5];
  int (*paiVar67) [5];
  int (*paiVar68) [5];
  undefined4 uVar69;
  undefined4 uVar70;
  double dVar71;
  int (*local_118) [5];
  int (*local_108) [5];
  int (*local_100) [5];
  int (*local_f8) [5];
  int (*local_f0) [5];
  int (*local_e0) [5];
  int (*local_d8) [5];
  int (*local_b8) [5];
  int (*local_b0) [5];
  
  pvVar11 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memset(pvVar11->param_file,0,0x100);
  pcVar12 = last_parameter_file();
  if (pcVar12 != (char *)0x0) {
    pcVar12 = last_parameter_file();
    strncpy(pvVar11->param_file,pcVar12,0xff);
  }
  memcpy(&pvVar11->model_details,md,0x7e8);
  uVar1 = md->temperature;
  uVar2 = md->betaScale;
  pvVar11->temperature = (double)uVar1;
  pvVar11->alpha = (double)uVar2;
  dVar6 = (double)uVar2 * ((double)uVar1 + 273.15) * 1.98717;
  pvVar11->kT = dVar6;
  pvVar11->pf_scale = pfs;
  iVar3 = md->pf_smooth;
  dVar9 = ((double)uVar1 + 273.15) / Tmeasure;
  pvVar11->lxc = lxc37 * dVar9;
  dVar7 = (double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar9;
  if (iVar3 == 0) {
    dVar7 = (double)(int)dVar7;
  }
  dVar7 = exp((dVar7 * -10.0) / dVar6);
  pvVar11->expDuplexInit = dVar7;
  dVar7 = (double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar9;
  if (iVar3 == 0) {
    dVar7 = (double)(int)dVar7;
  }
  dVar7 = exp((dVar7 * -10.0) / dVar6);
  pvVar11->expTermAU = dVar7;
  dVar7 = (double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar9;
  if (iVar3 == 0) {
    dVar7 = (double)(int)dVar7;
  }
  dVar7 = exp((dVar7 * -10.0) / dVar6);
  pvVar11->expMLbase = dVar7;
  dVar7 = (double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar9;
  if (iVar3 == 0) {
    dVar7 = (double)(int)dVar7;
  }
  dVar7 = exp((dVar7 * -10.0) / dVar6);
  pvVar11->expMLclosing = dVar7;
  dVar7 = (double)GQuadLayerMismatchH - (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar9
  ;
  if (iVar3 == 0) {
    dVar7 = (double)(int)dVar7;
  }
  dVar7 = exp((dVar7 * -10.0) / dVar6);
  pvVar11->expgquadLayerMismatch = dVar7;
  pvVar11->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  local_118 = (int (*) [5])(pvVar11->expgquad[2] + 3);
  lVar13 = 2;
  do {
    lVar54 = 0;
    do {
      iVar10 = GQuadBetadH;
      iVar4 = GQuadAlphadH;
      iVar48 = GQuadAlphadH - GQuadAlpha37;
      iVar19 = GQuadBetadH - GQuadBeta37;
      lVar62 = lVar54 + 1;
      dVar7 = log((double)(int)lVar62);
      dVar7 = ((double)iVar10 - (double)iVar19 * dVar9) * dVar7 +
              ((double)iVar4 - (double)iVar48 * dVar9) * (double)((int)lVar13 - 1);
      if (iVar3 == 0) {
        dVar7 = (double)(int)dVar7;
      }
      dVar7 = exp((dVar7 * -10.0) / dVar6);
      *(double *)((long)local_118 + lVar54 * 8) = dVar7;
      lVar54 = lVar62;
    } while (lVar62 != 0x2b);
    lVar13 = lVar13 + 1;
    local_118 = (int (*) [5])((long)local_118 + 0x170);
  } while (lVar13 != 8);
  lVar13 = 0;
  do {
    dVar7 = (double)hairpindH[lVar13] - (double)(hairpindH[lVar13] - hairpin37[lVar13]) * dVar9;
    if (iVar3 == 0) {
      dVar7 = (double)(int)dVar7;
    }
    dVar7 = exp((dVar7 * -10.0) / dVar6);
    pvVar11->exphairpin[lVar13] = dVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x1f);
  lVar13 = 0;
  do {
    dVar7 = (double)*(int *)((long)bulgedH + lVar13) -
            (double)(*(int *)((long)bulgedH + lVar13) - *(int *)((long)bulge37 + lVar13)) * dVar9;
    if (iVar3 == 0) {
      dVar7 = (double)(int)dVar7;
    }
    dVar7 = exp((dVar7 * -10.0) / dVar6);
    *(double *)((long)pvVar11->expbulge + lVar13 * 2) = dVar7;
    dVar7 = (double)*(int *)((long)internal_loopdH + lVar13) -
            (double)(*(int *)((long)internal_loopdH + lVar13) -
                    *(int *)((long)internal_loop37 + lVar13)) * dVar9;
    if (iVar3 == 0) {
      dVar7 = (double)(int)dVar7;
    }
    dVar7 = exp((dVar7 * -10.0) / dVar6);
    *(double *)((long)pvVar11->expinternal + lVar13 * 2) = dVar7;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x7c);
  if (james_rule != 0) {
    dVar7 = exp(-800.0 / dVar6);
    pvVar11->expinternal[2] = dVar7;
  }
  dVar7 = (double)niniodH - (double)(niniodH - ninio37) * dVar9;
  if (iVar3 == 0) {
    dVar7 = (double)(int)dVar7;
  }
  lVar13 = 0;
  do {
    dVar71 = (double)(int)lVar13 * dVar7;
    dVar8 = (double)MAX_NINIO;
    if (dVar71 <= (double)MAX_NINIO) {
      dVar8 = dVar71;
    }
    dVar8 = exp((dVar8 * -10.0) / dVar6);
    pvVar11->expninio[2][lVar13] = dVar8;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x1f);
  if (Tetraloops[0] != '\0') {
    uVar21 = 0;
    uVar53 = 7;
    do {
      dVar7 = (double)TetraloopdH[uVar21] -
              (double)(TetraloopdH[uVar21] - Tetraloop37[uVar21]) * dVar9;
      if (iVar3 == 0) {
        dVar7 = (double)(int)dVar7;
      }
      dVar7 = exp((dVar7 * -10.0) / dVar6);
      pvVar11->exptetra[uVar21] = dVar7;
      uVar21 = (ulong)((int)uVar21 + 1);
      sVar14 = strlen(Tetraloops);
      bVar5 = uVar53 < sVar14;
      uVar53 = (ulong)((int)uVar53 + 7);
    } while (bVar5);
  }
  if (Triloops[0] != '\0') {
    uVar21 = 0;
    uVar53 = 5;
    do {
      dVar7 = (double)TriloopdH[uVar21] - (double)(TriloopdH[uVar21] - Triloop37[uVar21]) * dVar9;
      if (iVar3 == 0) {
        dVar7 = (double)(int)dVar7;
      }
      dVar7 = exp((dVar7 * -10.0) / dVar6);
      pvVar11->exptri[uVar21] = dVar7;
      uVar21 = (ulong)((int)uVar21 + 1);
      sVar14 = strlen(Triloops);
      bVar5 = uVar53 < sVar14;
      uVar53 = (ulong)((int)uVar53 + 5);
    } while (bVar5);
  }
  if (Hexaloops[0] != '\0') {
    uVar20 = 0;
    uVar53 = 9;
    do {
      dVar7 = (double)HexaloopdH[uVar20] - (double)(HexaloopdH[uVar20] - Hexaloop37[uVar20]) * dVar9
      ;
      if (iVar3 == 0) {
        dVar7 = (double)(int)dVar7;
      }
      dVar7 = exp((dVar7 * -10.0) / dVar6);
      pvVar11->exphex[uVar20] = dVar7;
      uVar20 = uVar20 + 1;
      sVar14 = strlen(Hexaloops);
      bVar5 = uVar53 < sVar14;
      uVar53 = (ulong)((int)uVar53 + 9);
    } while (bVar5);
  }
  lVar13 = 0xc7fb;
  do {
    dVar7 = (double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar9;
    if (iVar3 == 0) {
      dVar7 = (double)(int)dVar7;
    }
    dVar7 = exp((dVar7 * -10.0) / dVar6);
    *(double *)((long)(pvVar11->expstack + -1) + 0x38 + lVar13 * 8) = dVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xc803);
  padVar22 = pvVar11->expdangle5;
  local_d8 = dangle5_dH;
  paiVar60 = dangle5_37;
  paiVar38 = dangle3_dH;
  paiVar49 = dangle3_37;
  lVar13 = 0;
  do {
    lVar54 = 0;
    do {
      if (md->dangles == 0) {
        *(undefined8 *)((long)*padVar22 + lVar54 * 2) = 0x3ff0000000000000;
        uVar69 = 0;
        uVar70 = 0x3ff00000;
      }
      else {
        iVar4 = *(int *)((long)*local_d8 + lVar54);
        dVar7 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar60 + lVar54)) * dVar9;
        if (iVar3 == 0) {
          dVar8 = 0.0;
          if ((int)dVar7 < 1) {
            dVar8 = -(double)(int)dVar7;
          }
        }
        else {
          dVar71 = dVar7 / -10.0;
          dVar8 = 0.0;
          if (-1.2283697 <= dVar71) {
            if (dVar71 <= 0.8660254) {
              dVar7 = sin(dVar71 + -0.34242663);
              iVar4 = *(int *)((long)*local_d8 + lVar54);
              dVar8 = sin(((double)iVar4 -
                          (double)(iVar4 - *(int *)((long)*paiVar60 + lVar54)) * dVar9) / -10.0 +
                          -0.34242663);
              dVar8 = (dVar8 + 1.0) * (dVar7 + 1.0) * 3.8490018;
            }
            else {
              dVar8 = -dVar7;
            }
          }
        }
        dVar7 = exp((dVar8 * 10.0) / dVar6);
        *(double *)((long)*padVar22 + lVar54 * 2) = dVar7;
        iVar4 = *(int *)((long)*paiVar38 + lVar54);
        dVar7 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar49 + lVar54)) * dVar9;
        if (iVar3 == 0) {
          dVar8 = 0.0;
          if ((int)dVar7 < 1) {
            dVar8 = -(double)(int)dVar7;
          }
        }
        else {
          dVar71 = dVar7 / -10.0;
          dVar8 = 0.0;
          if (-1.2283697 <= dVar71) {
            if (dVar71 <= 0.8660254) {
              dVar7 = sin(dVar71 + -0.34242663);
              iVar4 = *(int *)((long)*paiVar38 + lVar54);
              dVar8 = sin(((double)iVar4 -
                          (double)(iVar4 - *(int *)((long)*paiVar49 + lVar54)) * dVar9) / -10.0 +
                          -0.34242663);
              dVar8 = (dVar8 + 1.0) * (dVar7 + 1.0) * 3.8490018;
            }
            else {
              dVar8 = -dVar7;
            }
          }
        }
        dVar7 = exp((dVar8 * 10.0) / dVar6);
        uVar69 = SUB84(dVar7,0);
        uVar70 = (undefined4)((ulong)dVar7 >> 0x20);
      }
      *(ulong *)((long)padVar22[8] + lVar54 * 2) = CONCAT44(uVar70,uVar69);
      lVar54 = lVar54 + 4;
    } while (lVar54 != 0x14);
    lVar13 = lVar13 + 1;
    padVar22 = padVar22 + 1;
    local_d8 = local_d8 + 1;
    paiVar60 = paiVar60 + 1;
    paiVar38 = paiVar38 + 1;
    paiVar49 = paiVar49 + 1;
  } while (lVar13 != 8);
  padVar23 = pvVar11->expstack;
  paiVar55 = stackdH;
  paiVar61 = stack37;
  lVar13 = 0;
  do {
    lVar54 = 0;
    do {
      iVar4 = *(int *)((long)*paiVar55 + lVar54);
      dVar7 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar61 + lVar54)) * dVar9;
      if (iVar3 == 0) {
        dVar7 = (double)(int)dVar7;
      }
      dVar7 = exp((dVar7 * -10.0) / dVar6);
      *(double *)((long)*padVar23 + lVar54 * 2) = dVar7;
      lVar54 = lVar54 + 4;
    } while (lVar54 != 0x20);
    lVar13 = lVar13 + 1;
    paiVar55 = paiVar55 + 1;
    paiVar61 = paiVar61 + 1;
    padVar23 = padVar23 + 1;
  } while (lVar13 != 8);
  paaiVar50 = mismatchIdH;
  paaiVar24 = mismatchI37;
  paaiVar56 = mismatch1nIdH;
  paaiVar15 = mismatch1nI37;
  paaiVar17 = mismatchHdH;
  paaiVar18 = mismatchH37;
  paaiVar32 = mismatch23IdH;
  paaiVar33 = mismatch23I37;
  paaiVar34 = mismatchMdH;
  paaiVar35 = mismatchM37;
  paaiVar36 = mismatchExtdH;
  paaiVar37 = mismatchExt37;
  lVar13 = 0;
  pvVar39 = pvVar11;
  do {
    lVar54 = 0;
    paiVar38 = *paaiVar24;
    pvVar40 = pvVar39;
    paiVar49 = *paaiVar50;
    paiVar60 = *paaiVar56;
    local_118 = *paaiVar32;
    local_108 = *paaiVar18;
    local_100 = *paaiVar17;
    local_f8 = *paaiVar36;
    local_f0 = *paaiVar37;
    local_e0 = *paaiVar15;
    local_d8 = *paaiVar33;
    local_b8 = *paaiVar34;
    local_b0 = *paaiVar35;
    do {
      lVar62 = 0;
      do {
        iVar4 = *(int *)((long)*(int (*) [5])*paiVar49 + lVar62);
        dVar7 = (double)iVar4 -
                (double)(iVar4 - *(int *)((long)*(int (*) [5])*paiVar38 + lVar62)) * dVar9;
        if (iVar3 == 0) {
          dVar7 = (double)(int)dVar7;
        }
        dVar7 = exp((dVar7 * -10.0) / dVar6);
        *(double *)((long)pvVar40->expmismatchI[0][0] + lVar62 * 2) = dVar7;
        iVar4 = *(int *)((long)*(int (*) [5])*paiVar60 + lVar62);
        dVar7 = (double)iVar4 -
                (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_e0 + lVar62)) * dVar9;
        if (iVar3 == 0) {
          dVar7 = (double)(int)dVar7;
        }
        dVar7 = exp((dVar7 * -10.0) / dVar6);
        *(double *)((long)pvVar40->expmismatch1nI[0][0] + lVar62 * 2) = dVar7;
        iVar4 = *(int *)((long)*(int (*) [5])*local_100 + lVar62);
        dVar7 = (double)iVar4 -
                (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_108 + lVar62)) * dVar9;
        if (iVar3 == 0) {
          dVar7 = (double)(int)dVar7;
        }
        dVar7 = exp((dVar7 * -10.0) / dVar6);
        *(double *)((long)pvVar40->expmismatchH[0][0] + lVar62 * 2) = dVar7;
        iVar4 = *(int *)((long)*(int (*) [5])*local_118 + lVar62);
        dVar7 = (double)iVar4 -
                (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_d8 + lVar62)) * dVar9;
        if (iVar3 == 0) {
          dVar7 = (double)(int)dVar7;
        }
        dVar7 = exp((dVar7 * -10.0) / dVar6);
        *(double *)((long)pvVar40->expmismatch23I[0][0] + lVar62 * 2) = dVar7;
        if (md->dangles == 0) {
          *(undefined8 *)((long)pvVar40->expmismatchExt[0][0] + lVar62 * 2) = 0x3ff0000000000000;
          lVar16 = 0x2430;
          uVar69 = 0;
          uVar70 = 0x3ff00000;
        }
        else {
          iVar4 = *(int *)((long)*(int (*) [5])*local_b8 + lVar62);
          dVar7 = (double)iVar4 -
                  (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_b0 + lVar62)) * dVar9;
          if (iVar3 == 0) {
            dVar8 = 0.0;
            if ((int)dVar7 < 1) {
              dVar8 = -(double)(int)dVar7;
            }
          }
          else {
            dVar71 = dVar7 / -10.0;
            dVar8 = 0.0;
            if (-1.2283697 <= dVar71) {
              if (dVar71 <= 0.8660254) {
                dVar7 = sin(dVar71 + -0.34242663);
                iVar4 = *(int *)((long)*(int (*) [5])*local_b8 + lVar62);
                dVar8 = sin(((double)iVar4 -
                            (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_b0 + lVar62)) *
                            dVar9) / -10.0 + -0.34242663);
                dVar8 = (dVar8 + 1.0) * (dVar7 + 1.0) * 3.8490018;
              }
              else {
                dVar8 = -dVar7;
              }
            }
          }
          dVar7 = exp((dVar8 * 10.0) / dVar6);
          *(double *)((long)pvVar40->expmismatchM[0][0] + lVar62 * 2) = dVar7;
          iVar4 = *(int *)((long)*(int (*) [5])*local_f8 + lVar62);
          dVar7 = (double)iVar4 -
                  (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_f0 + lVar62)) * dVar9;
          if (iVar3 == 0) {
            dVar8 = 0.0;
            if ((int)dVar7 < 1) {
              dVar8 = -(double)(int)dVar7;
            }
          }
          else {
            dVar71 = dVar7 / -10.0;
            dVar8 = 0.0;
            if (-1.2283697 <= dVar71) {
              if (dVar71 <= 0.8660254) {
                dVar7 = sin(dVar71 + -0.34242663);
                iVar4 = *(int *)((long)*(int (*) [5])*local_f8 + lVar62);
                dVar8 = sin(((double)iVar4 -
                            (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_f0 + lVar62)) *
                            dVar9) / -10.0 + -0.34242663);
                dVar8 = (dVar8 + 1.0) * (dVar7 + 1.0) * 3.8490018;
              }
              else {
                dVar8 = -dVar7;
              }
            }
          }
          dVar7 = exp((dVar8 * 10.0) / dVar6);
          uVar69 = SUB84(dVar7,0);
          uVar70 = (undefined4)((ulong)dVar7 >> 0x20);
          lVar16 = 0x4f0;
        }
        *(ulong *)((long)(pvVar40->expstack + -1) + 0x38 + lVar62 * 2 + lVar16) =
             CONCAT44(uVar70,uVar69);
        lVar62 = lVar62 + 4;
      } while (lVar62 != 0x14);
      lVar54 = lVar54 + 1;
      pvVar40 = (vrna_exp_param_t *)(pvVar40->expstack[0] + 4);
      paiVar49 = paiVar49 + 1;
      paiVar38 = paiVar38 + 1;
      paiVar60 = paiVar60 + 1;
      local_e0 = local_e0 + 1;
      local_100 = local_100 + 1;
      local_108 = local_108 + 1;
      local_118 = local_118 + 1;
      local_d8 = local_d8 + 1;
      local_b8 = local_b8 + 1;
      local_b0 = local_b0 + 1;
      local_f8 = local_f8 + 1;
      local_f0 = local_f0 + 1;
    } while (lVar54 != 5);
    lVar13 = lVar13 + 1;
    pvVar39 = (vrna_exp_param_t *)(pvVar39->expstack + 3);
    paaiVar50 = (int (*) [5] [5])((long)paaiVar50 + 100);
    paaiVar24 = (int (*) [5] [5])((long)paaiVar24 + 100);
    paaiVar56 = (int (*) [5] [5])((long)paaiVar56 + 100);
    paaiVar15 = (int (*) [5] [5])((long)paaiVar15 + 100);
    paaiVar17 = (int (*) [5] [5])((long)paaiVar17 + 100);
    paaiVar18 = (int (*) [5] [5])((long)paaiVar18 + 100);
    paaiVar32 = (int (*) [5] [5])((long)paaiVar32 + 100);
    paaiVar33 = (int (*) [5] [5])((long)paaiVar33 + 100);
    paaiVar34 = (int (*) [5] [5])((long)paaiVar34 + 100);
    paaiVar35 = (int (*) [5] [5])((long)paaiVar35 + 100);
    paaiVar36 = (int (*) [5] [5])((long)paaiVar36 + 100);
    paaiVar37 = (int (*) [5] [5])((long)paaiVar37 + 100);
  } while (lVar13 != 8);
  paaadVar25 = pvVar11->expint11;
  paaaiVar57 = int11_dH;
  paaaiVar63 = int11_37;
  lVar13 = 0;
  do {
    lVar54 = 0;
    paaadVar26 = paaadVar25;
    paiVar38 = (int (*) [5])paaaiVar57;
    paiVar49 = (int (*) [5])paaaiVar63;
    do {
      lVar62 = 0;
      paaadVar27 = paaadVar26;
      paiVar60 = paiVar38;
      paiVar66 = paiVar49;
      do {
        lVar16 = 0;
        do {
          iVar4 = (*(int (*) [5] [5])*paiVar60)[0][lVar16];
          dVar7 = (double)iVar4 - (double)(iVar4 - (*(int (*) [5] [5])*paiVar66)[0][lVar16]) * dVar9
          ;
          if (iVar3 == 0) {
            dVar7 = (double)(int)dVar7;
          }
          dVar7 = exp((dVar7 * -10.0) / dVar6);
          (*paaadVar27)[0][0][lVar16] = dVar7;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 5);
        lVar62 = lVar62 + 1;
        paiVar60 = paiVar60 + 1;
        paiVar66 = paiVar66 + 1;
        paaadVar27 = (double (*) [8] [5] [5])((*paaadVar27)[0] + 1);
      } while (lVar62 != 5);
      lVar54 = lVar54 + 1;
      paiVar38 = paiVar38 + 5;
      paiVar49 = paiVar49 + 5;
      paaadVar26 = (double (*) [8] [5] [5])(*paaadVar26 + 1);
    } while (lVar54 != 8);
    lVar13 = lVar13 + 1;
    paaaiVar57 = (int (*) [8] [5] [5])((long)paaaiVar57 + 800);
    paaaiVar63 = (int (*) [8] [5] [5])((long)paaaiVar63 + 800);
    paaadVar25 = paaadVar25 + 1;
  } while (lVar13 != 8);
  paaaadVar28 = pvVar11->expint21;
  paaaaiVar41 = int21_dH;
  paaaaiVar64 = int21_37;
  lVar13 = 0;
  do {
    lVar54 = 0;
    paaaadVar29 = paaaadVar28;
    paiVar38 = (int (*) [5])paaaaiVar41;
    paiVar49 = (int (*) [5])paaaaiVar64;
    do {
      lVar62 = 0;
      paaaadVar30 = paaaadVar29;
      paiVar60 = paiVar38;
      paiVar66 = paiVar49;
      do {
        lVar16 = 0;
        paaaadVar31 = paaaadVar30;
        paiVar42 = paiVar60;
        paiVar67 = paiVar66;
        do {
          lVar51 = 0;
          do {
            iVar4 = (*(int (*) [5] [5] [5])*paiVar42)[0][0][lVar51];
            dVar7 = (double)iVar4 -
                    (double)(iVar4 - (*(int (*) [5] [5] [5])*paiVar67)[0][0][lVar51]) * dVar9;
            if (iVar3 == 0) {
              dVar7 = (double)(int)dVar7;
            }
            dVar7 = exp((dVar7 * -10.0) / dVar6);
            (*paaaadVar31)[0][0][0][lVar51] = dVar7;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 5);
          lVar16 = lVar16 + 1;
          paiVar42 = paiVar42 + 1;
          paiVar67 = paiVar67 + 1;
          paaaadVar31 = (double (*) [8] [5] [5] [5])((*paaaadVar31)[0][0] + 1);
        } while (lVar16 != 5);
        lVar62 = lVar62 + 1;
        paiVar60 = paiVar60 + 5;
        paiVar66 = paiVar66 + 5;
        paaaadVar30 = (double (*) [8] [5] [5] [5])((*paaaadVar30)[0] + 1);
      } while (lVar62 != 5);
      lVar54 = lVar54 + 1;
      paiVar38 = paiVar38 + 0x19;
      paiVar49 = paiVar49 + 0x19;
      paaaadVar29 = (double (*) [8] [5] [5] [5])(*paaaadVar29 + 1);
    } while (lVar54 != 8);
    lVar13 = lVar13 + 1;
    paaaaiVar41 = (int (*) [8] [5] [5] [5])((long)paaaaiVar41 + 4000);
    paaaaiVar64 = (int (*) [8] [5] [5] [5])((long)paaaaiVar64 + 4000);
    paaaadVar28 = paaaadVar28 + 1;
  } while (lVar13 != 8);
  paaaaadVar43 = pvVar11->expint22;
  paaaaaiVar58 = int22_dH;
  paaaaaiVar65 = int22_37;
  lVar13 = 0;
  do {
    lVar54 = 0;
    paaaaadVar44 = paaaaadVar43;
    paiVar38 = (int (*) [5])paaaaaiVar58;
    paiVar49 = (int (*) [5])paaaaaiVar65;
    do {
      lVar62 = 0;
      paaaaadVar45 = paaaaadVar44;
      paiVar60 = paiVar38;
      paiVar66 = paiVar49;
      do {
        lVar16 = 0;
        paaaaadVar46 = paaaaadVar45;
        paiVar42 = paiVar60;
        paiVar67 = paiVar66;
        do {
          lVar51 = 0;
          paaaaadVar47 = paaaaadVar46;
          paiVar59 = paiVar42;
          paiVar68 = paiVar67;
          do {
            lVar52 = 0;
            do {
              iVar4 = (*(int (*) [5] [5] [5] [5])*paiVar59)[0][0][0][lVar52];
              dVar7 = (double)iVar4 -
                      (double)(iVar4 - (*(int (*) [5] [5] [5] [5])*paiVar68)[0][0][0][lVar52]) *
                      dVar9;
              if (iVar3 == 0) {
                dVar7 = (double)(int)dVar7;
              }
              dVar7 = exp((dVar7 * -10.0) / dVar6);
              (*paaaaadVar47)[0][0][0][0][lVar52] = dVar7;
              lVar52 = lVar52 + 1;
            } while (lVar52 != 5);
            lVar51 = lVar51 + 1;
            paiVar59 = paiVar59 + 1;
            paiVar68 = paiVar68 + 1;
            paaaaadVar47 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar47)[0][0][0] + 1);
          } while (lVar51 != 5);
          lVar16 = lVar16 + 1;
          paiVar42 = paiVar42 + 5;
          paiVar67 = paiVar67 + 5;
          paaaaadVar46 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar46)[0][0] + 1);
        } while (lVar16 != 5);
        lVar62 = lVar62 + 1;
        paiVar60 = paiVar60 + 0x19;
        paiVar66 = paiVar66 + 0x19;
        paaaaadVar45 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar45)[0] + 1);
      } while (lVar62 != 5);
      lVar54 = lVar54 + 1;
      paiVar38 = paiVar38 + 0x7d;
      paiVar49 = paiVar49 + 0x7d;
      paaaaadVar44 = (double (*) [8] [5] [5] [5] [5])(*paaaaadVar44 + 1);
    } while (lVar54 != 8);
    lVar13 = lVar13 + 1;
    paaaaaiVar58 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar58 + 20000);
    paaaaaiVar65 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar65 + 20000);
    paaaaadVar43 = paaaaadVar43 + 1;
  } while (lVar13 != 8);
  strncpy(pvVar11->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar11->Triloops,Triloops,0xf1);
  strncpy(pvVar11->Hexaloops,Hexaloops,0x169);
  return pvVar11;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_scaled_exp_params(vrna_md_t *md,
                      double    pfs)
{
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kT, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));

  memset(pf->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(pf->param_file, last_parameter_file(), 255);

  pf->model_details = *md;
  pf->temperature   = md->temperature;
  pf->alpha         = md->betaScale;
  pf->kT            = kT = md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf->pf_scale      = pfs;
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kT);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kT);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kT);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kT);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kT);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kT);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kT);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kT);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kT);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kT);

  GT = RESCALE_dG(bulge37[30],
                  bulgedH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(internal_loop37[30],
                  internal_loopdH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * TRUNC_MAYBE(GT)) * 10. / kT);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kT);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kT);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kT);

  for (i = 0; i <= NBPAIRS; i++)
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kT);

  /* if dangles==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j]  = RESCALE_BF_SMOOTH(dangle5_37[i][j], dangle5_dH[i][j], TT, kT);
        pf->expdangle3[i][j]  = RESCALE_BF_SMOOTH(dangle3_37[i][j], dangle3_dH[i][j], TT, kT);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j], stackdH[i][j], TT, kT);

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kT);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kT);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kT);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kT);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kT);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kT);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kT);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}